

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

char * __thiscall glslang::HlslGrammar::getTypeString(HlslGrammar *this,EHlslTokenClass tokenClass)

{
  if ((int)tokenClass < 0xa1) {
    switch(tokenClass) {
    case EHTokBool:
      return "bool";
    case EHTokInt:
      return "int";
    case EHTokUint:
      return "uint";
    case EHTokUint64:
    case EHTokDword:
      break;
    case EHTokHalf:
      return "half";
    case EHTokFloat:
      return "float";
    case EHTokDouble:
      return "double";
    case EHTokMin16float:
      return "min16float";
    case EHTokMin10float:
      return "min10float";
    case EHTokMin16int:
      return "min16int";
    case EHTokMin12int:
      return "min12int";
    default:
      if (tokenClass == EHTokSample) {
        return "sample";
      }
      if (tokenClass == EHTokLayout) {
        return "layout";
      }
    }
  }
  else {
    switch(tokenClass) {
    case EHTokHalf1x1:
      return "half1x1";
    case EHTokHalf1x2:
      return "half1x2";
    case EHTokHalf1x3:
      return "half1x3";
    case EHTokHalf1x4:
      return "half1x4";
    case EHTokHalf2x1:
      return "half2x1";
    case EHTokHalf2x2:
      return "half2x2";
    case EHTokHalf2x3:
      return "half2x3";
    case EHTokHalf2x4:
      return "half2x4";
    case EHTokHalf3x1:
      return "half3x1";
    case EHTokHalf3x2:
      return "half3x2";
    case EHTokHalf3x3:
      return "half3x3";
    case EHTokHalf3x4:
      return "half3x4";
    case EHTokHalf4x1:
      return "half4x1";
    case EHTokHalf4x2:
      return "half4x2";
    case EHTokHalf4x3:
      return "half4x3";
    case EHTokHalf4x4:
      return "half4x4";
    }
    if (tokenClass == EHTokConstantBuffer) {
      return "ConstantBuffer";
    }
  }
  return (char *)0x0;
}

Assistant:

const char* HlslGrammar::getTypeString(EHlslTokenClass tokenClass) const
{
    switch (tokenClass) {
    case EHTokSample:     return "sample";
    case EHTokHalf:       return "half";
    case EHTokHalf1x1:    return "half1x1";
    case EHTokHalf1x2:    return "half1x2";
    case EHTokHalf1x3:    return "half1x3";
    case EHTokHalf1x4:    return "half1x4";
    case EHTokHalf2x1:    return "half2x1";
    case EHTokHalf2x2:    return "half2x2";
    case EHTokHalf2x3:    return "half2x3";
    case EHTokHalf2x4:    return "half2x4";
    case EHTokHalf3x1:    return "half3x1";
    case EHTokHalf3x2:    return "half3x2";
    case EHTokHalf3x3:    return "half3x3";
    case EHTokHalf3x4:    return "half3x4";
    case EHTokHalf4x1:    return "half4x1";
    case EHTokHalf4x2:    return "half4x2";
    case EHTokHalf4x3:    return "half4x3";
    case EHTokHalf4x4:    return "half4x4";
    case EHTokBool:       return "bool";
    case EHTokFloat:      return "float";
    case EHTokDouble:     return "double";
    case EHTokInt:        return "int";
    case EHTokUint:       return "uint";
    case EHTokMin16float: return "min16float";
    case EHTokMin10float: return "min10float";
    case EHTokMin16int:   return "min16int";
    case EHTokMin12int:   return "min12int";
    case EHTokConstantBuffer: return "ConstantBuffer";
    case EHTokLayout:     return "layout";
    default:
        return nullptr;
    }
}